

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  uint local_68;
  char *local_60;
  int k_1;
  int b_1;
  char *vn;
  int t;
  int k;
  int b;
  OpCode op;
  Instruction i;
  int pc;
  char **name_local;
  int reg_local;
  int lastpc_local;
  Proto *p_local;
  
  pcVar3 = luaF_getlocalname(p,reg + 1,lastpc);
  *name = pcVar3;
  if (*name != (char *)0x0) {
    p_local = (Proto *)anon_var_dwarf_52df;
    return (char *)p_local;
  }
  iVar1 = findsetreg(p,lastpc,reg);
  if (iVar1 != -1) {
    local_68 = p->code[iVar1];
    uVar2 = local_68 & 0x3f;
    switch(uVar2) {
    case 0:
      if (local_68 >> 0x17 < (local_68 >> 6 & 0xff)) {
        pcVar3 = getobjname(p,iVar1,local_68 >> 0x17,name);
        return pcVar3;
      }
      break;
    case 1:
    case 2:
      if (uVar2 == 1) {
        local_68 = local_68 >> 0xe;
      }
      else {
        local_68 = p->code[iVar1 + 1] >> 6;
      }
      if ((p->k[(int)local_68].tt_ & 0xfU) == 4) {
        *name = (char *)(p->k[(int)local_68].value_.f + 0x18);
        p_local = (Proto *)anon_var_dwarf_533a;
        return (char *)p_local;
      }
      break;
    default:
      break;
    case 5:
      pcVar3 = upvalname(p,local_68 >> 0x17);
      *name = pcVar3;
      p_local = (Proto *)anon_var_dwarf_5323;
      return (char *)p_local;
    case 6:
    case 7:
      if (uVar2 == 7) {
        local_60 = luaF_getlocalname(p,(local_68 >> 0x17) + 1,iVar1);
      }
      else {
        local_60 = upvalname(p,local_68 >> 0x17);
      }
      kname(p,iVar1,local_68 >> 0xe & 0x1ff,name);
      bVar4 = false;
      if (local_60 != (char *)0x0) {
        iVar1 = strcmp(local_60,"_ENV");
        bVar4 = iVar1 == 0;
      }
      if (!bVar4) {
        return "field";
      }
      return "global";
    case 0xc:
      kname(p,iVar1,local_68 >> 0xe & 0x1ff,name);
      p_local = (Proto *)0x127db1;
      return (char *)p_local;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *getobjname(Proto *p, int lastpc, int reg,
                              const char **name) {
    int pc;
    *name = luaF_getlocalname(p, reg + 1, lastpc);
    if (*name)  /* is a local? */
        return "local";
    /* else try symbolic execution */
    pc = findsetreg(p, lastpc, reg);
    if (pc != -1) {  /* could find instruction? */
        Instruction i = p->code[pc];
        OpCode op = GET_OPCODE(i);
        switch (op) {
            case OP_MOVE: {
                int b = GETARG_B(i);  /* move from 'b' to 'a' */
                if (b < GETARG_A(i))
                    return getobjname(p, pc, b, name);  /* get name for 'b' */
                break;
            }
            case OP_GETTABUP:
            case OP_GETTABLE: {
                int k = GETARG_C(i);  /* key index */
                int t = GETARG_B(i);  /* table index */
                const char *vn = (op == OP_GETTABLE)  /* name of indexed variable */
                                 ? luaF_getlocalname(p, t + 1, pc)
                                 : upvalname(p, t);
                kname(p, pc, k, name);
                return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
            }
            case OP_GETUPVAL: {
                *name = upvalname(p, GETARG_B(i));
                return "upvalue";
            }
            case OP_LOADK:
            case OP_LOADKX: {
                int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                         : GETARG_Ax(p->code[pc + 1]);
                if (ttisstring(&p->k[b])) {
                    *name = svalue(&p->k[b]);
                    return "constant";
                }
                break;
            }
            case OP_SELF: {
                int k = GETARG_C(i);  /* key index */
                kname(p, pc, k, name);
                return "method";
            }
            default:
                break;  /* go through to return NULL */
        }
    }
    return NULL;  /* could not find reasonable name */
}